

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemSizeCalculator.cpp
# Opt level: O0

int __thiscall MemSizeCalculator::calculateVariable(MemSizeCalculator *this,Variable *variable)

{
  SymbolTable *this_00;
  bool bVar1;
  Class *_class;
  vector<int,_std::allocator<int>_> *this_01;
  reference piVar2;
  const_iterator cStack_70;
  int _size;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int size;
  string local_48;
  Class *local_28;
  Class *classToCalculate;
  Variable *variable_local;
  MemSizeCalculator *this_local;
  
  classToCalculate = (Class *)variable;
  variable_local = (Variable *)this;
  bVar1 = Variable::isTypeId(variable);
  if (bVar1) {
    this_00 = this->symbolTable;
    Variable::getRawType_abi_cxx11_(&local_48,(Variable *)classToCalculate);
    _class = Semantic::SymbolTable::getClass(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    local_28 = _class;
    if ((_class->isMemSizeAlreadyCalculated & 1U) == 0) {
      this_local._4_4_ = calculateClass(this,_class);
    }
    else {
      this_local._4_4_ = Class::getSize(_class);
    }
  }
  else {
    __range2._0_4_ = 4;
    bVar1 = Variable::isArray((Variable *)classToCalculate);
    if (bVar1) {
      this_01 = Variable::getArraySize((Variable *)classToCalculate);
      __end2 = std::vector<int,_std::allocator<int>_>::begin(this_01);
      cStack_70 = std::vector<int,_std::allocator<int>_>::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff90), bVar1) {
        piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&__end2);
        __range2._0_4_ = *piVar2 * (int)__range2;
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&__end2);
      }
    }
    Variable::setSize((Variable *)classToCalculate,(int)__range2);
    this_local._4_4_ = (int)__range2;
  }
  return this_local._4_4_;
}

Assistant:

int MemSizeCalculator::calculateVariable(Variable *variable) {
    if (variable->isTypeId()) {
        auto classToCalculate = symbolTable->getClass(variable->getRawType());
        if (classToCalculate->isMemSizeAlreadyCalculated) return classToCalculate->getSize();
        else { return calculateClass(classToCalculate); }
    }
    int size = 4;
    if (variable->isArray())
        for (int _size : variable->getArraySize()) size *= _size;
    variable->setSize(size);
    return size;
}